

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerHLSL::is_user_type_structured(CompilerHLSL *this,uint32_t id)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  
  if ((this->hlsl_options).preserve_structured_buffers == true) {
    psVar2 = Compiler::get_decoration_string_abi_cxx11_
                       ((Compiler *)this,(ID)id,DecorationUserTypeGOOGLE);
    iVar1 = ::std::__cxx11::string::compare((ulong)psVar2,0,(char *)0x10);
    bVar3 = true;
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((ulong)psVar2,0,(char *)0x12);
      if (iVar1 != 0) {
        iVar1 = ::std::__cxx11::string::compare((ulong)psVar2,0,(char *)0x21);
        bVar3 = iVar1 == 0;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompilerHLSL::is_user_type_structured(uint32_t id) const
{
	if (hlsl_options.preserve_structured_buffers)
	{
		// Compare left hand side of string only as these user types can contain more meta data such as their subtypes,
		// e.g. "structuredbuffer:int"
		const std::string &user_type = get_decoration_string(id, DecorationUserTypeGOOGLE);
		return user_type.compare(0, 16, "structuredbuffer") == 0 ||
		       user_type.compare(0, 18, "rwstructuredbuffer") == 0 ||
		       user_type.compare(0, 33, "rasterizerorderedstructuredbuffer") == 0;
	}
	return false;
}